

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoleFilter.h
# Opt level: O0

void __thiscall
Iir::PoleFilter<Iir::ChebyshevI::BandStopBase,_Iir::DirectFormI,_4,_8>::PoleFilter
          (PoleFilter<Iir::ChebyshevI::BandStopBase,_Iir::DirectFormI,_4,_8> *this)

{
  CascadeStages<4,_Iir::DirectFormI> *in_RDI;
  Storage SVar1;
  LayoutBase *digitalStorage;
  LayoutBase *analogStorage;
  CascadeStages<4,_Iir::DirectFormI> *in_stack_ffffffffffffffb0;
  Storage local_18;
  
  ChebyshevI::BandStopBase::BandStopBase((BandStopBase *)0x1031c8);
  CascadeStages<4,_Iir::DirectFormI>::CascadeStages(in_stack_ffffffffffffffb0);
  digitalStorage = (LayoutBase *)(in_RDI[1].m_stages + 2);
  memset(digitalStorage,0,0x80);
  Layout<4>::Layout((Layout<4> *)in_RDI);
  analogStorage = (LayoutBase *)(in_RDI[1].m_states + 1);
  memset(analogStorage,0,0x100);
  Layout<8>::Layout((Layout<8> *)in_RDI);
  SVar1 = CascadeStages<4,_Iir::DirectFormI>::getCascadeStorage
                    ((CascadeStages<4,_Iir::DirectFormI> *)0x103232);
  local_18.stageArray = SVar1.stageArray;
  local_18.maxStages = SVar1.maxStages;
  Cascade::setCascadeStorage((Cascade *)in_RDI,&local_18);
  Layout::operator_cast_to_LayoutBase((Layout<4> *)digitalStorage);
  Layout::operator_cast_to_LayoutBase((Layout<8> *)digitalStorage);
  PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>::setPrototypeStorage
            ((PoleFilterBase<Iir::ChebyshevI::AnalogLowPass> *)in_RDI,analogStorage,digitalStorage);
  CascadeStages<4,_Iir::DirectFormI>::reset(in_RDI);
  return;
}

Assistant:

PoleFilter ()
			{
				// This glues together the factored base classes
				// with the templatized storage classes.
				BaseClass::setCascadeStorage (this->getCascadeStorage());
				BaseClass::setPrototypeStorage (m_analogStorage, m_digitalStorage);
				CascadeStages<(MaxDigitalPoles + 1) / 2 , StateType>::reset();
			}